

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_xoris(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = ctx->opcode;
  uVar3 = uVar1 >> 0x15 & 0x1f;
  uVar2 = uVar1 >> 0x10 & 0x1f;
  if (uVar3 == uVar2 && (uVar1 & 0xffff) == 0) {
    return;
  }
  tcg_gen_xori_i64_ppc64
            (ctx->uc->tcg_ctx,cpu_gpr[uVar2],cpu_gpr[uVar3],(ulong)((uVar1 & 0xffff) << 0x10));
  return;
}

Assistant:

static void gen_xoris(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = UIMM(ctx->opcode);

    if (rS(ctx->opcode) == rA(ctx->opcode) && uimm == 0) {
        /* NOP */
        return;
    }
    tcg_gen_xori_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rS(ctx->opcode)],
                    uimm << 16);
}